

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

Ref<embree::SceneGraph::Node>
embree::SceneGraph::convert_quads_to_subdivs(Ref<embree::SceneGraph::Node> *node)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  Ref<embree::SceneGraph::Node> *pRVar4;
  long *plVar5;
  reference pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar7;
  size_type sVar8;
  reference pvVar9;
  long *in_RSI;
  Node *in_RDI;
  size_t i_2;
  size_t i_1;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *p;
  iterator __end5;
  iterator __begin5;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *__range5;
  Ref<embree::SceneGraph::SubdivMeshNode> smesh;
  Ref<embree::SceneGraph::QuadMeshNode> tmesh;
  size_t i;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::MultiTransformNode> xfmNode_1;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff8c8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffff8d0;
  value_type *in_stack_fffffffffffff8d8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff8e0;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *in_stack_fffffffffffff968;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffff970;
  vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *this;
  size_t in_stack_fffffffffffff998;
  Ref<embree::SceneGraph::MaterialNode> *in_stack_fffffffffffff9a0;
  SubdivMeshNode *in_stack_fffffffffffff9a8;
  BBox1f in_stack_fffffffffffff9b0;
  long *local_558;
  long *local_4e8;
  long *local_488;
  Ref<embree::SceneGraph::Node> *local_428;
  ulong local_3f8;
  ulong local_3f0;
  __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
  local_3d8;
  long *local_3d0;
  undefined1 local_3c1;
  long local_3c0;
  long *local_3b8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_3b0;
  long *local_3a8;
  Node *local_3a0;
  Node *local_398;
  ulong local_390;
  long *local_388;
  long *local_380;
  long local_378;
  long *local_370;
  Node *local_368;
  Node *local_360;
  
  if (*in_RSI == 0) {
    local_428 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_428 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RSI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_428 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_428->ptr->fileName)();
  }
  if (local_428 == (Ref<embree::SceneGraph::Node> *)0x0) {
    if (*in_RSI == 0) {
      local_488 = (long *)0x0;
    }
    else {
      local_488 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&MultiTransformNode::typeinfo,0);
    }
    local_370 = local_488;
    if (local_488 != (long *)0x0) {
      (**(code **)(*local_488 + 0x10))();
    }
    if (local_370 == (long *)0x0) {
      if (*in_RSI == 0) {
        local_4e8 = (long *)0x0;
      }
      else {
        local_4e8 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&GroupNode::typeinfo,0);
      }
      local_388 = local_4e8;
      if (local_4e8 != (long *)0x0) {
        (**(code **)(*local_4e8 + 0x10))();
      }
      if (local_388 == (long *)0x0) {
        if (*in_RSI == 0) {
          local_558 = (long *)0x0;
        }
        else {
          local_558 = (long *)__dynamic_cast(*in_RSI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        local_3a8 = local_558;
        if (local_558 != (long *)0x0) {
          (**(code **)(*local_558 + 0x10))();
        }
        if (local_3a8 == (long *)0x0) {
          bVar3 = false;
        }
        else {
          pvVar7 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)::operator_new(0x1b0);
          local_3c1 = 1;
          local_3b8 = (long *)local_3a8[0x1a];
          if (local_3b8 != (long *)0x0) {
            (**(code **)(*local_3b8 + 0x10))();
          }
          local_3c0 = local_3a8[0xd];
          SubdivMeshNode::SubdivMeshNode
                    (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,in_stack_fffffffffffff9b0,
                     in_stack_fffffffffffff998);
          local_3c1 = 0;
          local_3b0 = pvVar7;
          if (pvVar7 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            (**(code **)((long)(pvVar7->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start + 0x10))();
          }
          if (local_3b8 != (long *)0x0) {
            (**(code **)(*local_3b8 + 0x18))();
          }
          local_3d0 = local_3a8 + 0xe;
          local_3d8._M_current =
               (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
               std::
               vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
               ::begin(in_stack_fffffffffffff8c8);
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::end(in_stack_fffffffffffff8c8);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                     *)in_stack_fffffffffffff8d0,
                                    (__normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
                                     *)in_stack_fffffffffffff8c8), bVar3) {
            __gnu_cxx::
            __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
            ::operator*(&local_3d8);
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::push_back(in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
            __gnu_cxx::
            __normal_iterator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_*,_std::vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>_>
            ::operator++(&local_3d8);
          }
          for (local_3f0 = 0;
              sVar8 = std::
                      vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                      ::size((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                              *)(local_3a8 + 0x17)), local_3f0 < sVar8; local_3f0 = local_3f0 + 1) {
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)(local_3a8 + 0x17),local_3f0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff8e0,(value_type_conflict2 *)in_stack_fffffffffffff8d8);
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)(local_3a8 + 0x17),local_3f0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff8e0,(value_type_conflict2 *)in_stack_fffffffffffff8d8);
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)(local_3a8 + 0x17),local_3f0);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff8e0,(value_type_conflict2 *)in_stack_fffffffffffff8d8);
            pvVar9 = std::
                     vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                     ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                                   *)(local_3a8 + 0x17),local_3f0);
            uVar1 = pvVar9->v2;
            pvVar9 = std::
                     vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                     ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                                   *)(local_3a8 + 0x17),local_3f0);
            if (uVar1 != pvVar9->v3) {
              std::
              vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
              ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                            *)(local_3a8 + 0x17),local_3f0);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         in_stack_fffffffffffff8e0,(value_type_conflict2 *)in_stack_fffffffffffff8d8
                        );
            }
          }
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::operator=(in_stack_fffffffffffff970,
                      (vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                       *)in_stack_fffffffffffff968);
          sVar8 = std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::size((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                          *)&local_3b0[5].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage);
          if (sVar8 != 0) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff970,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       in_stack_fffffffffffff968);
          }
          this = (vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                 (local_3a8 + 0x14);
          std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::operator=
                    (this,in_stack_fffffffffffff968);
          pvVar7 = local_3b0;
          sVar8 = std::vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_>::size
                            ((vector<embree::Vec2<float>,_std::allocator<embree::Vec2<float>_>_> *)
                             &local_3b0[6].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
          if (sVar8 != 0) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,pvVar7);
          }
          for (local_3f8 = 0;
              sVar8 = std::
                      vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                      ::size((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                              *)(local_3a8 + 0x17)), local_3f8 < sVar8; local_3f8 = local_3f8 + 1) {
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)(local_3a8 + 0x17),local_3f8);
            std::
            vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
            ::operator[]((vector<embree::SceneGraph::QuadMeshNode::Quad,_std::allocator<embree::SceneGraph::QuadMeshNode::Quad>_>
                          *)(local_3a8 + 0x17),local_3f8);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                      (in_stack_fffffffffffff8d0,(value_type_conflict2 *)in_stack_fffffffffffff8c8);
          }
          (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_3b0;
          if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
            (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
          }
          bVar3 = true;
          if (local_3b0 != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
            (**(code **)((long)(local_3b0->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_start + 0x18))();
          }
        }
        if (local_3a8 != (long *)0x0) {
          (**(code **)(*local_3a8 + 0x18))();
        }
        if (!bVar3) goto LAB_001de8b9;
      }
      else {
        for (local_390 = 0; uVar2 = local_390,
            sVar8 = std::
                    vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                    ::size((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                            *)(local_388 + 0xd)), uVar2 < sVar8; local_390 = local_390 + 1) {
          pvVar6 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_388 + 0xd),local_390);
          local_3a0 = pvVar6->ptr;
          if (local_3a0 != (Node *)0x0) {
            (*(local_3a0->super_RefCount)._vptr_RefCount[2])();
          }
          convert_quads_to_subdivs(local_428);
          pvVar6 = std::
                   vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                   ::operator[]((vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
                                 *)(local_388 + 0xd),local_390);
          if (pvVar6->ptr != (Node *)0x0) {
            (*(pvVar6->ptr->super_RefCount)._vptr_RefCount[3])();
          }
          pvVar6->ptr = local_398;
          local_398 = (Node *)0x0;
          if (local_3a0 != (Node *)0x0) {
            (*(local_3a0->super_RefCount)._vptr_RefCount[3])();
          }
        }
LAB_001de8b9:
        bVar3 = false;
      }
      if (local_388 != (long *)0x0) {
        (**(code **)(*local_388 + 0x18))();
      }
      if (!bVar3) goto LAB_001de955;
    }
    else {
      local_380 = (long *)local_370[0x10];
      if (local_380 != (long *)0x0) {
        (**(code **)(*local_380 + 0x10))();
      }
      convert_quads_to_subdivs(local_428);
      plVar5 = local_370 + 0x10;
      if (*plVar5 != 0) {
        (**(code **)(*(long *)*plVar5 + 0x18))();
      }
      *plVar5 = local_378;
      local_378 = 0;
      if (local_380 != (long *)0x0) {
        (**(code **)(*local_380 + 0x18))();
      }
LAB_001de955:
      bVar3 = false;
    }
    if (local_370 != (long *)0x0) {
      (**(code **)(*local_370 + 0x18))();
    }
    if (bVar3) goto LAB_001de9ff;
  }
  else {
    local_368 = local_428[0x13].ptr;
    if (local_368 != (Node *)0x0) {
      (*(local_368->super_RefCount)._vptr_RefCount[2])();
    }
    convert_quads_to_subdivs(local_428);
    pRVar4 = local_428 + 0x13;
    if (pRVar4->ptr != (Node *)0x0) {
      (*(pRVar4->ptr->super_RefCount)._vptr_RefCount[3])();
    }
    pRVar4->ptr = local_360;
    local_360 = (Node *)0x0;
    if (local_368 != (Node *)0x0) {
      (*(local_368->super_RefCount)._vptr_RefCount[3])();
    }
  }
  bVar3 = false;
LAB_001de9ff:
  if (local_428 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_428->ptr->fileName)._M_string_length)();
  }
  if (!bVar3) {
    (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)*in_RSI;
    *in_RSI = 0;
  }
  return (Ref<embree::SceneGraph::Node>)in_RDI;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::convert_quads_to_subdivs(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) {
      xfmNode->child = convert_quads_to_subdivs(xfmNode->child);
    }
    else if (Ref<SceneGraph::MultiTransformNode> xfmNode = node.dynamicCast<SceneGraph::MultiTransformNode>()) {
      xfmNode->child = convert_quads_to_subdivs(xfmNode->child);
    }
    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (size_t i=0; i<groupNode->children.size(); i++) 
        groupNode->children[i] = convert_quads_to_subdivs(groupNode->children[i]);
    }
    else if (Ref<SceneGraph::QuadMeshNode> tmesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      Ref<SceneGraph::SubdivMeshNode> smesh = new SceneGraph::SubdivMeshNode(tmesh->material,tmesh->time_range,0);

      for (auto& p : tmesh->positions)
        smesh->positions.push_back(p);

      for (size_t i=0; i<tmesh->quads.size(); i++) {
        smesh->position_indices.push_back(tmesh->quads[i].v0);
        smesh->position_indices.push_back(tmesh->quads[i].v1);
        smesh->position_indices.push_back(tmesh->quads[i].v2);
        if (tmesh->quads[i].v2 != tmesh->quads[i].v3)
          smesh->position_indices.push_back(tmesh->quads[i].v3);
      }
      
      smesh->normals = tmesh->normals;
      if (smesh->normals.size())
        smesh->normal_indices = smesh->position_indices;
      
      smesh->texcoords = tmesh->texcoords;
      if (smesh->texcoords.size())
        smesh->texcoord_indices = smesh->position_indices;
      
      for (size_t i=0; i<tmesh->quads.size(); i++) 
        smesh->verticesPerFace.push_back(3 + (int)(tmesh->quads[i].v2 != tmesh->quads[i].v3));

      return smesh.dynamicCast<SceneGraph::Node>();
    }
    return node;
  }